

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

value_type __thiscall
djb::brdf::sample(brdf *this,vec2 *u,vec3 *wi,vec3 *wo_out,float_t *pdf_out,void *user_args)

{
  float *extraout_RDX;
  float *extraout_RDX_00;
  float *pfVar1;
  float fVar2;
  float_t fVar3;
  value_type vVar4;
  value_type fr;
  valarray<float> local_60;
  undefined8 local_50;
  float_t local_48;
  _Expr<std::__detail::_BinClos<std::__divides,_std::_ValArray,_std::_Constant,_float,_float>,_float>
  local_40;
  
  fVar3 = 0.0;
  if (wo_out->z <= 0.0) {
    if (user_args != (void *)0x0) {
      *(undefined4 *)user_args = 0;
    }
    (**(code **)((long)*u + 0x10))(this,u);
    pfVar1 = extraout_RDX;
  }
  else {
    local_50 = (**(code **)((long)*u + 0x30))(u,wi,wo_out,0);
    local_48 = fVar3;
    (**(code **)*u)(&local_60,u,wo_out,&local_50,fr._M_size);
    fVar2 = (float)(**(code **)((long)*u + 0x28))(u,wo_out,&local_50,fr._M_size);
    if (pdf_out != (float_t *)0x0) {
      pdf_out[2] = local_48;
      *(undefined8 *)pdf_out = local_50;
    }
    if (user_args != (void *)0x0) {
      *(float *)user_args = fVar2;
    }
    if (fVar2 <= 0.0) {
      (**(code **)((long)*u + 0x10))(this,u);
    }
    else {
      local_40._M_closure.super__BinBase2<std::__divides,_std::valarray<float>_>._M_expr1 =
           &local_60;
      local_40._M_closure.super__BinBase2<std::__divides,_std::valarray<float>_>._M_expr2 = fVar2;
      std::valarray<float>::
      valarray<std::__detail::_BinClos<std::__divides,std::_ValArray,std::_Constant,float,float>>
                ((valarray<float> *)this,&local_40);
    }
    operator_delete(local_60._M_data);
    pfVar1 = extraout_RDX_00;
  }
  vVar4._M_data = pfVar1;
  vVar4._M_size = (size_t)this;
  return vVar4;
}

Assistant:

brdf::value_type
brdf::sample(
	const vec2 &u,
	const vec3 &wi,
	vec3 *wo_out,
	float_t *pdf_out,
	const void *user_args
) const {
	if (wi.z > 0) {
		vec3 wo = u2_to_s2(u, wi);
		brdf::value_type fr = eval(wi, wo, user_args);
		float_t pdf = this->pdf(wi, wo, user_args);

		if (wo_out) (*wo_out) = wo;
		if (pdf_out) (*pdf_out) = pdf;

		return pdf > 0 ? fr / pdf : zero_value();
	} else {
		if (pdf_out) (*pdf_out) = 0;

		return zero_value();
	}
}